

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O2

void ztlex_fungetc(int c,ztlex_t *lex)

{
  char *pcVar1;
  
  if (c == 10) {
    lex->line = lex->line + -1;
    lex->column = lex->prevcolumn;
    lex->prevcolumn = -1;
  }
  else {
    lex->column = lex->column + -1;
  }
  pcVar1 = lex->ungottenptr;
  if ((long)(pcVar1 + (-0x10 - (long)lex)) < 0x100) {
    lex->ungottenptr = pcVar1 + 1;
    *pcVar1 = (char)c;
  }
  return;
}

Assistant:

static void ztlex_fungetc(int c, ztlex_t *lex)
{
  if (c == '\n')
  {
    assert(lex->line >= 0);
    lex->line--;
    assert(lex->prevcolumn >= 0);
    lex->column     = lex->prevcolumn;
    lex->prevcolumn = -1; /* invalidate */
  }
  else
  {
    lex->column--;
  }

  if (lex->ungottenptr - lex->ungotten < MAXUNGOTTEN)
    *lex->ungottenptr++ = c;
}